

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t allocate_and_set_string(char *src,char *default_src,char **dst,char *err_detail)

{
  int iVar1;
  aom_codec_err_t aVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (src == (char *)0x0) {
    builtin_strncpy(err_detail,"Null pointer given to a string parameter.",0x2a);
    aVar2 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    pcVar4 = *dst;
    if ((pcVar4 == (char *)0x0) || (iVar1 = strcmp(src,pcVar4), iVar1 != 0)) {
      if (pcVar4 != default_src) {
        aom_free(pcVar4);
      }
      if ((default_src == (char *)0x0) || (iVar1 = strcmp(src,default_src), iVar1 != 0)) {
        sVar3 = strlen(src);
        pcVar4 = (char *)aom_malloc(sVar3 + 1);
        if (pcVar4 == (char *)0x0) {
          builtin_strncpy(err_detail,"Failed to allocate memory for copying parameters.",0x32);
          return AOM_CODEC_MEM_ERROR;
        }
        memcpy(pcVar4,src,sVar3 + 1);
        *dst = pcVar4;
      }
      else {
        *dst = default_src;
      }
    }
    aVar2 = AOM_CODEC_OK;
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t allocate_and_set_string(const char *src,
                                               const char *default_src,
                                               const char **dst,
                                               char *err_detail) {
  if (!src) {
    snprintf(err_detail, ARG_ERR_MSG_MAX_LEN,
             "Null pointer given to a string parameter.");
    return AOM_CODEC_INVALID_PARAM;
  }
  if (*dst && strcmp(src, *dst) == 0) return AOM_CODEC_OK;
  // If the input is exactly the same as default, we will use the string
  // literal, so do not free here.
  if (*dst != default_src) {
    aom_free((void *)*dst);
  }

  if (default_src && strcmp(src, default_src) == 0) {
    // default_src should be a string literal
    *dst = default_src;
  } else {
    size_t len = strlen(src) + 1;
    char *tmp = aom_malloc(len * sizeof(*tmp));
    if (!tmp) {
      snprintf(err_detail, ARG_ERR_MSG_MAX_LEN,
               "Failed to allocate memory for copying parameters.");
      return AOM_CODEC_MEM_ERROR;
    }
    memcpy(tmp, src, len);
    *dst = tmp;
  }
  return 0;
}